

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

bool flatbuffers::SetGlobalTestLocale(char *locale_name,string *_value)

{
  char *__s;
  size_t sVar1;
  long *local_40 [2];
  long local_30 [2];
  
  __s = setlocale(6,locale_name);
  if (_value != (string *)0x0 && __s != (char *)0x0) {
    local_40[0] = local_30;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,__s,__s + sVar1);
    std::__cxx11::string::operator=((string *)_value,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  return __s != (char *)0x0;
}

Assistant:

bool SetGlobalTestLocale(const char *locale_name, std::string *_value) {
  const auto the_locale = setlocale(LC_ALL, locale_name);
  if (!the_locale) return false;
  if (_value) *_value = std::string(the_locale);
  return true;
}